

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int toLocaltime(DateTime *p,sqlite3_context *pCtx)

{
  uint uVar1;
  ulong uVar2;
  tm *ptVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  DateTime local_98;
  tm local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.tm_isdst = 0;
  local_68._36_4_ = 0;
  local_68.tm_gmtoff = 0;
  local_68.tm_mon = 0;
  local_68.tm_year = 0;
  local_68.tm_wday = 0;
  local_68.tm_yday = 0;
  local_68.tm_sec = 0;
  local_68.tm_min = 0;
  local_68.tm_hour = 0;
  local_68.tm_mday = 0;
  local_68.tm_zone = (char *)0x0;
  computeJD(p);
  if (p->iJD - 0xc1bc387b0a01U < 0xfffffe0c05d817ff) {
    local_98.iJD = p->iJD;
    local_98.Y = p->Y;
    local_98.M = p->M;
    local_98.D = p->D;
    local_98.h = p->h;
    local_98.m = p->m;
    local_98.tz = p->tz;
    local_98.s = p->s;
    local_98.validJD = p->validJD;
    local_98.validYMD = p->validYMD;
    local_98.validHMS = p->validHMS;
    local_98.nFloor = p->nFloor;
    local_98._44_4_ = *(undefined4 *)&p->field_0x2c;
    computeYMD_HMS(&local_98);
    iVar4 = local_98.Y % 4 + 2000;
    iVar5 = local_98.Y - iVar4;
    local_98.Y = iVar4;
    local_98._40_8_ = local_98._40_8_ & 0xffffffffffffff00;
    computeJD(&local_98);
    uVar2 = local_98.iJD / 1000;
    iVar5 = iVar5 + 0x76c;
  }
  else {
    uVar2 = (ulong)p->iJD / 1000;
    iVar5 = 0x76c;
  }
  local_98.iJD = uVar2 - 0x3118a36940;
  if (sqlite3Config.bLocaltimeFault == 0) {
    ptVar3 = localtime_r(&local_98.iJD,&local_68);
    uVar1 = (uint)(ptVar3 == (tm *)0x0);
LAB_001a1064:
    if (uVar1 == 0) {
      p->Y = iVar5 + local_68.tm_year;
      p->M = local_68.tm_mon + 1;
      p->D = local_68.tm_mday;
      p->h = local_68.tm_hour;
      p->m = local_68.tm_min;
      p->s = (double)(p->iJD % 1000) * 0.001 + (double)local_68.tm_sec;
      p->validYMD = '\x01';
      p->validHMS = '\x01';
      p->validJD = '\0';
      p->tz = 0;
      p->field_0x2c = p->field_0x2c & 0xfc;
      iVar5 = 0;
      goto LAB_001a10e3;
    }
  }
  else if (sqlite3Config.xAltLocaltime != (_func_int_void_ptr_void_ptr *)0x0) {
    uVar1 = (*sqlite3Config.xAltLocaltime)(&local_98,&local_68);
    goto LAB_001a1064;
  }
  sqlite3_result_error(pCtx,"local time unavailable",-1);
  iVar5 = 1;
LAB_001a10e3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int toLocaltime(
  DateTime *p,                   /* Date at which to calculate offset */
  sqlite3_context *pCtx          /* Write error here if one occurs */
){
  time_t t;
  struct tm sLocal;
  int iYearDiff;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  computeJD(p);
  if( p->iJD<2108667600*(i64)100000 /* 1970-01-01 */
   || p->iJD>2130141456*(i64)100000 /* 2038-01-18 */
  ){
    /* EVIDENCE-OF: R-55269-29598 The localtime_r() C function normally only
    ** works for years between 1970 and 2037. For dates outside this range,
    ** SQLite attempts to map the year into an equivalent year within this
    ** range, do the calculation, then map the year back.
    */
    DateTime x = *p;
    computeYMD_HMS(&x);
    iYearDiff = (2000 + x.Y%4) - x.Y;
    x.Y += iYearDiff;
    x.validJD = 0;
    computeJD(&x);
    t = (time_t)(x.iJD/1000 -  21086676*(i64)10000);
  }else{
    iYearDiff = 0;
    t = (time_t)(p->iJD/1000 -  21086676*(i64)10000);
  }
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    return SQLITE_ERROR;
  }
  p->Y = sLocal.tm_year + 1900 - iYearDiff;
  p->M = sLocal.tm_mon + 1;
  p->D = sLocal.tm_mday;
  p->h = sLocal.tm_hour;
  p->m = sLocal.tm_min;
  p->s = sLocal.tm_sec + (p->iJD%1000)*0.001;
  p->validYMD = 1;
  p->validHMS = 1;
  p->validJD = 0;
  p->rawS = 0;
  p->tz = 0;
  p->isError = 0;
  return SQLITE_OK;
}